

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::generateExtensionsList
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *type)

{
  pointer pEVar1;
  size_t __n;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  VulkanHppGenerator *this_00;
  pointer pEVar9;
  string previousLeave;
  string previousEnter;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  VulkanHppGenerator *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar8;
  pcVar4 = (char *)0x0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  pEVar9 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = paVar8;
  local_58 = this;
  if (pEVar9 != pEVar1) {
    paVar8 = &local_160.field_2;
    do {
      __n = (pEVar9->type)._M_string_length;
      if ((__n == type->_M_string_length) &&
         ((__n == 0 ||
          (iVar3 = bcmp((pEVar9->type)._M_dataplus._M_p,(type->_M_dataplus)._M_p,__n), iVar3 == 0)))
         ) {
        this_00 = local_58;
        getProtectFromTitle(&local_160,local_58,&pEVar9->name);
        generateProtection(&local_e0,this_00,&local_160,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != paVar8) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        if ((local_80._M_string_length == local_e0.first._M_string_length) &&
           ((local_80._M_string_length == 0 ||
            (iVar3 = bcmp(local_80._M_dataplus._M_p,local_e0.first._M_dataplus._M_p,
                          local_80._M_string_length), iVar3 == 0)))) {
          bVar2 = true;
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"\n","");
        }
        else {
          std::operator+(&local_50,"\n",&local_a0);
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_50,local_e0.first._M_dataplus._M_p,
                             local_e0.first._M_string_length);
          local_140._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
          paVar6 = &pbVar5->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p == paVar6) {
            local_140.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
            local_140.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
            local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          }
          else {
            local_140.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          }
          local_140._M_string_length = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
          bVar2 = false;
        }
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_140,"\"");
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar7 = &pbVar5->field_2;
        if (paVar6 == paVar7) {
          local_120.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_120.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_120.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_120._M_dataplus._M_p = (pointer)paVar6;
        }
        local_120._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_120,(pEVar9->name)._M_dataplus._M_p,
                           (pEVar9->name)._M_string_length);
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar7 = &pbVar5->field_2;
        if (paVar6 == paVar7) {
          local_100.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_100.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_100._M_dataplus._M_p = (pointer)paVar6;
        }
        local_100._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_100,"\", ");
        local_160._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar6 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p == paVar6) {
          local_160.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_160.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_160._M_dataplus._M_p = (pointer)paVar8;
        }
        else {
          local_160.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        }
        local_160._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_160._M_dataplus._M_p,local_160._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != paVar8) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        if ((!bVar2) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2)) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_80,&local_e0.first);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_a0,&local_e0.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.second._M_dataplus._M_p != &local_e0.second.field_2) {
          operator_delete(local_e0.second._M_dataplus._M_p,
                          local_e0.second.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
          operator_delete(local_e0.first._M_dataplus._M_p,
                          local_e0.first.field_2._M_allocated_capacity + 1);
        }
      }
      pEVar9 = pEVar9 + 1;
    } while (pEVar9 != pEVar1);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(__return_storage_ptr__->_M_dataplus)._M_p;
    pcVar4 = (char *)__return_storage_ptr__->_M_string_length;
  }
  local_e0.first._M_dataplus._M_p = pcVar4;
  local_e0.first._M_string_length = (size_type)paVar8;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_e0,", ");
  if (!bVar2) {
    __assert_fail("extensionsList.ends_with( \", \" )",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x1dc5,
                  "std::string VulkanHppGenerator::generateExtensionsList(const std::string &) const"
                 );
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_e0.first,__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length - 2);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (__return_storage_ptr__,&local_e0.first);
  paVar8 = &local_e0.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != paVar8) {
    operator_delete(local_e0.first._M_dataplus._M_p,local_e0.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_a0._M_string_length != 0) {
    std::operator+(&local_e0.first,"\n",&local_a0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,local_e0.first._M_dataplus._M_p,
               local_e0.first._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.first._M_dataplus._M_p != paVar8) {
      operator_delete(local_e0.first._M_dataplus._M_p,
                      local_e0.first.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateExtensionsList( std::string const & type ) const
{
  std::string extensionsList, previousEnter, previousLeave;
  for ( auto const & extension : m_extensions )
  {
    if ( extension.type == type )
    {
      const auto [enter, leave] = generateProtection( getProtectFromTitle( extension.name ) );
      extensionsList += ( ( previousEnter != enter ) ? ( "\n" + previousLeave + enter ) : "\n" ) + "\"" + extension.name + "\", ";
      previousEnter = enter;
      previousLeave = leave;
    }
  }
  assert( extensionsList.ends_with( ", " ) );
  extensionsList = extensionsList.substr( 0, extensionsList.length() - 2 );
  if ( !previousLeave.empty() )
  {
    extensionsList += "\n" + previousLeave;
  }
  return extensionsList;
}